

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_memory.h
# Opt level: O1

void * mk_mem_alloc_z(size_t size)

{
  void *pvVar1;
  
  pvVar1 = calloc(1,size);
  return pvVar1;
}

Assistant:

static inline ALLOCSZ_ATTR(1)
void *mk_mem_alloc_z(const size_t size)
{
#ifdef MALLOC_JEMALLOC
    void *buf = je_calloc(1, size);
#else
    void *buf = calloc(1, size);
#endif

    if (mk_unlikely(!buf)) {
        return NULL;
    }

    return buf;
}